

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void freeSection(Section *section,void *arg)

{
  Section *pSVar1;
  bool bVar2;
  long lVar3;
  uint32_t i;
  ulong uVar4;
  
  do {
    pSVar1 = section->nextu;
    free(section->name);
    bVar2 = sect_HasData(section->type);
    if (bVar2) {
      free(section->data);
      lVar3 = 0x20;
      for (uVar4 = 0; uVar4 < section->nbPatches; uVar4 = uVar4 + 1) {
        free(*(void **)((long)&section->patches->src + lVar3));
        lVar3 = lVar3 + 0x30;
      }
      free(section->patches);
    }
    free(section->symbols);
    free(section);
    section = pSVar1;
  } while (pSVar1 != (Section *)0x0);
  return;
}

Assistant:

static void freeSection(struct Section *section, void *arg)
{
	(void)arg;

	do {
		struct Section *next = section->nextu;

		free(section->name);
		if (sect_HasData(section->type)) {
			free(section->data);
			for (uint32_t i = 0; i < section->nbPatches; i++)
				free(section->patches[i].rpnExpression);
			free(section->patches);
		}
		free(section->symbols);
		free(section);

		section = next;
	} while (section);
}